

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserInputBufferCreateMem(void)

{
  int iVar1;
  int iVar2;
  xmlCharEncoding val;
  char *__s;
  size_t sVar3;
  xmlParserInputBufferPtr val_00;
  int local_34;
  int n_enc;
  xmlCharEncoding enc;
  int n_size;
  int size;
  int n_mem;
  char *mem;
  xmlParserInputBufferPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_size = 0; n_size < 4; n_size = n_size + 1) {
    for (n_enc = 0; n_enc < 4; n_enc = n_enc + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        __s = gen_const_char_ptr(n_size,0);
        iVar2 = gen_int(n_enc,1);
        val = gen_xmlCharEncoding(local_34,2);
        if ((__s == (char *)0x0) || (sVar3 = strlen(__s), iVar2 <= (int)sVar3 + 1)) {
          val_00 = (xmlParserInputBufferPtr)xmlParserInputBufferCreateMem(__s,iVar2,val);
          desret_xmlParserInputBufferPtr(val_00);
          call_tests = call_tests + 1;
          des_const_char_ptr(n_size,__s,0);
          des_int(n_enc,iVar2,1);
          des_xmlCharEncoding(local_34,val,2);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParserInputBufferCreateMem",
                   (ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)(uint)n_size);
            printf(" %d",(ulong)(uint)n_enc);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlParserInputBufferCreateMem(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputBufferPtr ret_val;
    char * mem; /* the memory input */
    int n_mem;
    int size; /* the length of the memory block */
    int n_size;
    xmlCharEncoding enc; /* the charset encoding if known */
    int n_enc;

    for (n_mem = 0;n_mem < gen_nb_const_char_ptr;n_mem++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_enc = 0;n_enc < gen_nb_xmlCharEncoding;n_enc++) {
        mem_base = xmlMemBlocks();
        mem = gen_const_char_ptr(n_mem, 0);
        size = gen_int(n_size, 1);
        enc = gen_xmlCharEncoding(n_enc, 2);
        if ((mem != NULL) &&
            (size > (int) strlen((const char *) mem) + 1))
            continue;

        ret_val = xmlParserInputBufferCreateMem((const char *)mem, size, enc);
        desret_xmlParserInputBufferPtr(ret_val);
        call_tests++;
        des_const_char_ptr(n_mem, (const char *)mem, 0);
        des_int(n_size, size, 1);
        des_xmlCharEncoding(n_enc, enc, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserInputBufferCreateMem",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_mem);
            printf(" %d", n_size);
            printf(" %d", n_enc);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}